

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O2

optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *
DecodeBase32(optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *__return_storage_ptr__,string_view str)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  size_t sVar4;
  ulong uVar5;
  size_t bits;
  ulong uVar6;
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ret;
  string_view str_local;
  value_type_conflict local_39;
  long local_38;
  
  str_local._M_str = str._M_str;
  str_local._M_len = str._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1  [16])str & (undefined1  [16])0x7) != (undefined1  [16])0x0) {
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
    _M_engaged = false;
    goto LAB_001b4129;
  }
  if (str_local._M_len == 0) {
LAB_001b406e:
    sVar4 = 0;
  }
  else {
    if (str_local._M_str[str_local._M_len - 1] == '=') {
      str_local._M_len = str_local._M_len - 1;
    }
    if (1 < str_local._M_len) {
      bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&str_local,str_local._M_len - 2,0xffffffffffffffff);
      __y._M_str = "==";
      __y._M_len = 2;
      bVar1 = std::operator==(bVar7,__y);
      if (bVar1) {
        str_local._M_len = str_local._M_len - 2;
      }
    }
    if (str_local._M_len == 0) goto LAB_001b406e;
    if (str_local._M_str[str_local._M_len - 1] == '=') {
      str_local._M_len = str_local._M_len - 1;
    }
    sVar4 = str_local._M_len;
    if (1 < str_local._M_len) {
      bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&str_local,str_local._M_len - 2,0xffffffffffffffff);
      __y_00._M_str = "==";
      __y_00._M_len = 2;
      bVar1 = std::operator==(bVar7,__y_00);
      sVar4 = str_local._M_len;
      if (bVar1) {
        sVar4 = str_local._M_len - 2;
        str_local._M_len = sVar4;
      }
    }
  }
  ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&ret,sVar4 * 5 >> 3);
  pbVar2 = (byte *)(str_local._M_str + str_local._M_len);
  uVar6 = 0;
  uVar5 = 0;
  for (pbVar3 = (byte *)str_local._M_str; pbVar3 != pbVar2; pbVar3 = pbVar3 + 1) {
    if ((long)DecodeBase32::decode32_table[*pbVar3] < 0) goto LAB_001b4115;
    uVar5 = (ulong)(((uint)uVar5 & 0x7f) << 5) | (long)DecodeBase32::decode32_table[*pbVar3];
    uVar6 = uVar6 + 5;
    while (7 < uVar6) {
      uVar6 = uVar6 - 8;
      local_39 = (value_type_conflict)(uVar5 >> ((byte)uVar6 & 0x3f));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&ret,&local_39);
    }
  }
  if ((uVar6 < 5) && ((uVar5 << (8U - (char)uVar6 & 0x3f) & 0xfe) == 0)) {
    *(pointer *)
     &(__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         = ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ._M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl + 8) =
         ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ._M_payload._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl + 0x10) =
         ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = true;
  }
  else {
LAB_001b4115:
    bVar1 = false;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>).
  _M_payload.
  super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
  .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
  _M_engaged = bVar1;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&ret.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_001b4129:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::vector<unsigned char>> DecodeBase32(std::string_view str)
{
    static const int8_t decode32_table[256]{
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, 26, 27, 28, 29, 30, 31, -1, -1, -1, -1,
        -1, -1, -1, -1, -1,  0,  1,  2,  3,  4,  5,  6,  7,  8,  9, 10, 11, 12, 13, 14,
        15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, -1, -1, -1, -1, -1, -1,  0,  1,  2,
         3,  4,  5,  6,  7,  8,  9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22,
        23, 24, 25, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1,
        -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1
    };

    if (str.size() % 8 != 0) return {};
    /* 1, 3, 4, or 6 padding '=' suffix characters are permitted. */
    if (str.size() >= 1 && str.back() == '=') str.remove_suffix(1);
    if (str.size() >= 2 && str.substr(str.size() - 2) == "==") str.remove_suffix(2);
    if (str.size() >= 1 && str.back() == '=') str.remove_suffix(1);
    if (str.size() >= 2 && str.substr(str.size() - 2) == "==") str.remove_suffix(2);

    std::vector<unsigned char> ret;
    ret.reserve((str.size() * 5) / 8);
    bool valid = ConvertBits<5, 8, false>(
        [&](unsigned char c) { ret.push_back(c); },
        str.begin(), str.end(),
        [](char c) { return decode32_table[uint8_t(c)]; }
    );

    if (!valid) return {};

    return ret;
}